

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O0

CubicSplinePtr __thiscall OpenMD::EAM::getPhi(EAM *this,AtomType *atomType1,AtomType *atomType2)

{
  double dVar1;
  EAMType EVar2;
  int iVar3;
  double *pdVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  vector<int,_std::allocator<int>_> *this_00;
  EAM *this_01;
  vector<double,_std::allocator<double>_> *yps;
  RealType RVar9;
  AtomType *in_RCX;
  AtomType *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  long in_RSI;
  element_type *in_RDI;
  RealType RVar11;
  CubicSpline *this_02;
  RealType *t;
  CubicSpline *this_03;
  vector<double,_std::allocator<double>_> *xps;
  double dVar12;
  CubicSplinePtr CVar13;
  uint i_3;
  RealType r_1;
  vector<double,_std::allocator<double>_> phivals_1;
  int i_2;
  int nr_1;
  RealType dr_1;
  RealType rmax_1;
  RealType lambda2;
  RealType kappa2;
  RealType beta2;
  RealType alpha2;
  RealType B2;
  RealType A2;
  RealType re2;
  RealType lambda1;
  RealType kappa1;
  RealType beta1;
  RealType alpha1;
  RealType B1;
  RealType A1;
  RealType re1;
  EAMAtomData *data2;
  EAMAtomData *data1;
  uint i_1;
  RealType zb;
  RealType za;
  int i;
  CubicSplinePtr rho2;
  CubicSplinePtr rho1;
  CubicSplinePtr z2;
  CubicSplinePtr z1;
  int nr;
  RealType r;
  RealType dr;
  RealType rmax;
  vector<double,_std::allocator<double>_> phivals;
  vector<double,_std::allocator<double>_> rvals;
  RealType phab;
  RealType phb;
  RealType pha;
  RealType rhb;
  RealType rha;
  EAMAdapter ea2;
  EAMAdapter ea1;
  CubicSplinePtr *cs;
  CubicSpline *in_stack_fffffffffffffb78;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb80;
  value_type_conflict1 *in_stack_fffffffffffffb88;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb90;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffba0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffba8;
  CubicSpline *in_stack_fffffffffffffbb0;
  RealType *in_stack_fffffffffffffbd8;
  CubicSpline *in_stack_fffffffffffffbe0;
  EAMAdapter *in_stack_fffffffffffffc00;
  EAMAdapter *in_stack_fffffffffffffc48;
  EAMAdapter *in_stack_fffffffffffffc90;
  double local_360;
  RealType local_340;
  vector<double,_std::allocator<double>_> *local_320;
  vector<double,_std::allocator<double>_> *local_300;
  uint local_234;
  int local_208;
  vector<double,_std::allocator<double>_> *local_200;
  CubicSpline *local_1f8;
  pointer local_1f0;
  NonBondedInteraction local_1e8;
  RealType local_1e0;
  RealType *local_1d8;
  CubicSpline *local_1d0;
  RealType local_1c8;
  RealType local_1c0;
  RealType local_1b8;
  RealType local_1b0;
  RealType local_1a8;
  RealType local_1a0;
  RealType local_198;
  RealType local_190;
  RealType local_188;
  RealType local_180;
  RealType local_178;
  reference local_170;
  reference local_168;
  uint local_15c;
  undefined8 local_158;
  double local_150;
  RealType local_148;
  double local_140;
  int local_134;
  RealType local_130;
  RealType local_128;
  double local_120;
  RealType local_118;
  double local_110;
  RealType local_108 [11];
  int local_ac;
  double local_a8;
  double local_a0;
  double local_98 [4];
  vector<double,_std::allocator<double>_> local_78;
  double local_60;
  double local_58;
  value_type_conflict1 *local_50;
  vector<double,_std::allocator<double>_> *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  byte local_31;
  EAMAdapter local_30;
  EAMAdapter local_28;
  AtomType *local_20;
  AtomType *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  EAMAdapter::EAMAdapter(&local_28,in_RDX);
  EAMAdapter::EAMAdapter(&local_30,local_20);
  local_31 = 0;
  std::make_shared<OpenMD::CubicSpline>();
  local_40 = (vector<double,_std::allocator<double>_> *)0x0;
  local_48 = (vector<double,_std::allocator<double>_> *)0x0;
  local_50 = (value_type_conflict1 *)0x0;
  local_58 = 0.0;
  local_60 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x3aa10a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x3aa117);
  local_98[0] = 0.0;
  EVar2 = EAMAdapter::getEAMType((EAMAdapter *)in_stack_fffffffffffffbb0);
  if ((EVar2 == eamFuncfl) &&
     (EVar2 = EAMAdapter::getEAMType((EAMAdapter *)in_stack_fffffffffffffbb0), EVar2 == eamFuncfl))
  {
    EAMAdapter::getZSpline(in_stack_fffffffffffffc48);
    EAMAdapter::getZSpline(in_stack_fffffffffffffc48);
    EAMAdapter::getRhoSpline(in_stack_fffffffffffffc48);
    EAMAdapter::getRhoSpline(in_stack_fffffffffffffc48);
    local_108[0] = EAMAdapter::getRcut(in_stack_fffffffffffffc00);
    pdVar4 = std::max<double>(local_98,local_108);
    local_98[0] = *pdVar4;
    iVar3 = EAMAdapter::getNr(in_stack_fffffffffffffc00);
    RVar11 = EAMAdapter::getDr(in_stack_fffffffffffffc00);
    local_110 = (double)iVar3 * RVar11;
    pdVar4 = std::max<double>(local_98,&local_110);
    local_98[0] = *pdVar4;
    local_118 = EAMAdapter::getRcut(in_stack_fffffffffffffc00);
    pdVar4 = std::max<double>(local_98,&local_118);
    local_98[0] = *pdVar4;
    iVar3 = EAMAdapter::getNr(in_stack_fffffffffffffc00);
    RVar11 = EAMAdapter::getDr(in_stack_fffffffffffffc00);
    local_120 = (double)iVar3 * RVar11;
    pdVar4 = std::max<double>(local_98,&local_120);
    local_98[0] = *pdVar4;
    local_128 = EAMAdapter::getDr(in_stack_fffffffffffffc00);
    local_130 = EAMAdapter::getDr(in_stack_fffffffffffffc00);
    pdVar4 = std::min<double>(&local_128,&local_130);
    local_a0 = *pdVar4;
    local_ac = (int)(local_98[0] / local_a0 + 0.5);
    for (local_134 = 0; local_134 < local_ac; local_134 = local_134 + 1) {
      local_140 = (double)local_134 * local_a0;
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffb80,(value_type_conflict1 *)in_stack_fffffffffffffb78);
    }
    local_158 = 0;
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffb80,(value_type_conflict1 *)in_stack_fffffffffffffb78);
    for (local_15c = 1; uVar5 = (ulong)local_15c,
        sVar6 = std::vector<double,_std::allocator<double>_>::size(&local_78), uVar5 < sVar6;
        local_15c = local_15c + 1) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_78,(ulong)local_15c);
      dVar12 = *pvVar7;
      local_a8 = dVar12;
      RVar11 = EAMAdapter::getRcut(in_stack_fffffffffffffc00);
      if (RVar11 < dVar12) {
        local_300 = (vector<double,_std::allocator<double>_> *)0x0;
      }
      else {
        std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3aa626);
        local_300 = (vector<double,_std::allocator<double>_> *)
                    CubicSpline::getValueAt(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      }
      dVar12 = local_a8;
      local_40 = local_300;
      RVar11 = EAMAdapter::getRcut(in_stack_fffffffffffffc00);
      if (RVar11 < dVar12) {
        local_320 = (vector<double,_std::allocator<double>_> *)0x0;
      }
      else {
        std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3aa6c4);
        local_320 = (vector<double,_std::allocator<double>_> *)
                    CubicSpline::getValueAt(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      }
      dVar12 = local_a8;
      local_48 = local_320;
      RVar11 = EAMAdapter::getRcut(in_stack_fffffffffffffc00);
      if (RVar11 < dVar12) {
        local_340 = 0.0;
      }
      else {
        std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3aa762);
        local_340 = CubicSpline::getValueAt(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      }
      dVar12 = local_a8;
      local_148 = local_340;
      RVar11 = EAMAdapter::getRcut(in_stack_fffffffffffffc00);
      if (RVar11 < dVar12) {
        local_360 = 0.0;
      }
      else {
        std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3aa800);
        local_360 = CubicSpline::getValueAt(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      }
      dVar12 = local_a8;
      local_150 = local_360;
      switch(*(undefined4 *)(in_RSI + 0xf8)) {
      case 0:
      case 2:
      case 3:
        local_60 = 0.0;
        if (0.0 < (double)local_40) {
          local_50 = (value_type_conflict1 *)
                     ((*(double *)(in_RSI + 0xd0) * local_148 * local_148) / local_a8);
          local_60 = ((double)local_48 / (double)local_40) * 0.5 * (double)local_50 + 0.0;
        }
        if (0.0 < (double)local_48) {
          local_58 = (*(double *)(in_RSI + 0xd0) * local_360 * local_360) / local_a8;
          local_60 = ((double)local_40 / (double)local_48) * 0.5 * local_58 + local_60;
        }
        break;
      case 1:
        RVar11 = EAMAdapter::getRcut(in_stack_fffffffffffffc00);
        dVar1 = local_a8;
        if ((RVar11 < dVar12) ||
           (RVar11 = EAMAdapter::getRcut(in_stack_fffffffffffffc00), RVar11 < dVar1)) {
          local_60 = 0.0;
        }
        else {
          local_60 = (*(double *)(in_RSI + 0xd0) * local_148 * local_150) / local_a8;
        }
        break;
      case 4:
      default:
        snprintf(painCave.errMsg,2000,"EAM::getPhi hit a mixing method it doesn\'t know about!\n");
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    }
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x3aaaff);
    CubicSpline::addPoints
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3aab26);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3aab33);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3aab40);
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3aab4d);
  }
  else {
    iVar3 = AtomType::getIdent(local_18);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x40),(long)iVar3);
    local_168 = std::vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>::operator[]
                          ((vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_> *)
                           (in_RSI + 0x58),(long)*pvVar8);
    this_00 = (vector<int,_std::allocator<int>_> *)(in_RSI + 0x40);
    iVar3 = AtomType::getIdent(local_20);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar3);
    local_170 = std::vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>::operator[]
                          ((vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_> *)
                           (in_RSI + 0x58),(long)*pvVar8);
    local_178 = EAMAdapter::getRe(in_stack_fffffffffffffc90);
    local_180 = EAMAdapter::getA(in_stack_fffffffffffffc90);
    local_188 = EAMAdapter::getB(in_stack_fffffffffffffc90);
    local_190 = EAMAdapter::getAlpha(in_stack_fffffffffffffc90);
    local_198 = EAMAdapter::getBeta(in_stack_fffffffffffffc90);
    local_1a0 = EAMAdapter::getKappa(in_stack_fffffffffffffc90);
    local_1a8 = EAMAdapter::getLambda(in_stack_fffffffffffffc90);
    local_1b0 = EAMAdapter::getRe(in_stack_fffffffffffffc90);
    local_1b8 = EAMAdapter::getA(in_stack_fffffffffffffc90);
    local_1c0 = EAMAdapter::getB(in_stack_fffffffffffffc90);
    local_1c8 = EAMAdapter::getAlpha(in_stack_fffffffffffffc90);
    this_02 = (CubicSpline *)EAMAdapter::getBeta(in_stack_fffffffffffffc90);
    local_1d0 = this_02;
    t = (RealType *)EAMAdapter::getKappa(in_stack_fffffffffffffc90);
    local_1d8 = t;
    local_1e0 = EAMAdapter::getLambda(in_stack_fffffffffffffc90);
    local_1e8._vptr_NonBondedInteraction = (_func_int **)0x0;
    pdVar4 = std::max<double>((double *)&local_1e8,&local_168->rcut);
    local_1e8._vptr_NonBondedInteraction = (_func_int **)*pdVar4;
    this_01 = (EAM *)std::max<double>((double *)&local_1e8,&local_170->rcut);
    local_1e8._vptr_NonBondedInteraction =
         (this_01->super_MetallicInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction;
    pdVar4 = std::max<double>((double *)&local_1e8,(double *)(in_RSI + 0xd8));
    local_1e8._vptr_NonBondedInteraction = (_func_int **)*pdVar4;
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x3aaf31);
    this_03 = (CubicSpline *)CubicSpline::getSpacing(in_stack_fffffffffffffb78);
    local_1f8 = this_03;
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x3aaf5d);
    xps = (vector<double,_std::allocator<double>_> *)
          CubicSpline::getSpacing(in_stack_fffffffffffffb78);
    local_200 = xps;
    yps = (vector<double,_std::allocator<double>_> *)
          std::min<double>((double *)&local_1f8,(double *)&local_200);
    local_1f0 = (yps->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
    dVar12 = (double)local_1e8._vptr_NonBondedInteraction / (double)local_1f0;
    for (local_208 = 0; local_208 < (int)(dVar12 + 1.0); local_208 = local_208 + 1) {
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffb80,(value_type_conflict1 *)in_stack_fffffffffffffb78);
    }
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x3ab046);
    local_234 = 0;
    while( true ) {
      RVar11 = (RealType)(ulong)local_234;
      RVar9 = (RealType)std::vector<double,_std::allocator<double>_>::size(&local_78);
      if ((ulong)RVar9 <= (ulong)RVar11) break;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_78,(ulong)local_234);
      dVar12 = *pvVar7;
      local_40 = (vector<double,_std::allocator<double>_> *)0x0;
      local_48 = (vector<double,_std::allocator<double>_> *)0x0;
      local_50 = (value_type_conflict1 *)0x0;
      local_58 = 0.0;
      local_60 = 0.0;
      if (dVar12 < local_168->rcut) {
        std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3ab107);
        in_stack_fffffffffffffb90 =
             (vector<double,_std::allocator<double>_> *)CubicSpline::getValueAt(this_02,t);
        local_40 = in_stack_fffffffffffffb90;
        in_stack_fffffffffffffb88 =
             (value_type_conflict1 *)
             Phi(this_01,(RealType)pdVar4,(RealType)this_03,(RealType)xps,(RealType)yps,RVar11,
                 (RealType)in_stack_fffffffffffffb90,(RealType)in_stack_fffffffffffffb88,
                 (RealType)in_stack_fffffffffffffb80);
        local_50 = in_stack_fffffffffffffb88;
      }
      if (dVar12 < local_170->rcut) {
        std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3ab1ef);
        in_stack_fffffffffffffb80 =
             (vector<double,_std::allocator<double>_> *)CubicSpline::getValueAt(this_02,t);
        local_48 = in_stack_fffffffffffffb80;
        local_58 = Phi(this_01,(RealType)pdVar4,(RealType)this_03,(RealType)xps,(RealType)yps,RVar11
                       ,(RealType)in_stack_fffffffffffffb90,(RealType)in_stack_fffffffffffffb88,
                       (RealType)in_stack_fffffffffffffb80);
      }
      if (dVar12 < local_168->rcut) {
        local_60 = ((double)local_48 / (double)local_40) * 0.5 * (double)local_50 + local_60;
      }
      if (dVar12 < local_170->rcut) {
        local_60 = ((double)local_40 / (double)local_48) * 0.5 * local_58 + local_60;
      }
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      local_234 = local_234 + 1;
    }
    std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x3ab376);
    CubicSpline::addPoints(this_03,xps,yps);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffb90);
  }
  local_31 = 1;
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffb90);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffb90);
  _Var10._M_pi = extraout_RDX;
  if ((local_31 & 1) == 0) {
    std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3ab401);
    _Var10._M_pi = extraout_RDX_00;
  }
  CVar13.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  CVar13.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (CubicSplinePtr)CVar13.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CubicSplinePtr EAM::getPhi(AtomType* atomType1, AtomType* atomType2) {
    EAMAdapter ea1 = EAMAdapter(atomType1);
    EAMAdapter ea2 = EAMAdapter(atomType2);

    CubicSplinePtr cs {std::make_shared<CubicSpline>()};

    RealType rha(0.0), rhb(0.0), pha(0.0), phb(0.0), phab(0.0);
    vector<RealType> rvals;
    vector<RealType> phivals;
    RealType rmax(0.0), dr, r;
    int nr;

    if (ea1.getEAMType() == eamFuncfl && ea2.getEAMType() == eamFuncfl) {
      CubicSplinePtr z1   = ea1.getZSpline();
      CubicSplinePtr z2   = ea2.getZSpline();
      CubicSplinePtr rho1 = ea1.getRhoSpline();
      CubicSplinePtr rho2 = ea2.getRhoSpline();

      // make the r grid:

      // we need phi out to the largest value we'll encounter in the
      // radial space;

      rmax = max(rmax, ea1.getRcut());
      rmax = max(rmax, ea1.getNr() * ea1.getDr());

      rmax = max(rmax, ea2.getRcut());
      rmax = max(rmax, ea2.getNr() * ea2.getDr());

      // use the smallest dr (finest grid) to build our grid:

      dr = min(ea1.getDr(), ea2.getDr());
      nr = int(rmax / dr + 0.5);

      for (int i = 0; i < nr; i++)
        rvals.push_back(RealType(i * dr));

      // construct the pair potential:

      RealType za, zb;

      phivals.push_back(0.0);

      for (unsigned int i = 1; i < rvals.size(); i++) {
        r = rvals[i];

        // only use z(r) if we're inside this atom's cutoff radius,
        // otherwise, we'll use zero for the charge.  This effectively
        // means that our phi grid goes out beyond the cutoff of the
        // pair potential

        rha = r <= ea1.getRcut() ? rho1->getValueAt(r) : 0.0;
        rhb = r <= ea2.getRcut() ? rho2->getValueAt(r) : 0.0;

        za = r <= ea1.getRcut() ? z1->getValueAt(r) : 0.0;
        zb = r <= ea2.getRcut() ? z2->getValueAt(r) : 0.0;

        switch (mixMeth_) {
        case eamJohnson:
        case eamDream1:
        case eamDream2:
          phab = 0.0;
          if (rha > 0.0) {
            pha  = pre11_ * (za * za) / r;
            phab = phab + 0.5 * (rhb / rha) * pha;
          }
          if (rhb > 0.0) {
            phb  = pre11_ * (zb * zb) / r;
            phab = phab + 0.5 * (rha / rhb) * phb;
          }

          break;

        case eamDaw:
          if (r <= ea1.getRcut() && r <= ea2.getRcut()) {
            phab = pre11_ * (za * zb) / r;
          } else {
            phab = 0.0;
          }

          break;
        case eamUnknownMix:
        default:

          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "EAM::getPhi hit a mixing method it doesn't know about!\n");
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }
        phivals.push_back(phab);
      }
      cs->addPoints(rvals, phivals);
    } else {
      EAMAtomData& data1 = EAMdata[EAMtids[atomType1->getIdent()]];
      EAMAtomData& data2 = EAMdata[EAMtids[atomType2->getIdent()]];

      RealType re1, A1, B1, alpha1, beta1, kappa1, lambda1;
      RealType re2, A2, B2, alpha2, beta2, kappa2, lambda2;

      re1     = ea1.getRe();
      A1      = ea1.getA();
      B1      = ea1.getB();
      alpha1  = ea1.getAlpha();
      beta1   = ea1.getBeta();
      kappa1  = ea1.getKappa();
      lambda1 = ea1.getLambda();

      re2     = ea2.getRe();
      A2      = ea2.getA();
      B2      = ea2.getB();
      alpha2  = ea2.getAlpha();
      beta2   = ea2.getBeta();
      kappa2  = ea2.getKappa();
      lambda2 = ea2.getLambda();

      RealType rmax = 0.0;
      rmax          = max(rmax, data1.rcut);
      rmax          = max(rmax, data2.rcut);
      rmax          = max(rmax, eamRcut_);

      // use the smallest dr (finest grid) to build our grid:

      RealType dr = min(data1.rho->getSpacing(), data2.rho->getSpacing());

      int nr = int(rmax / dr + 1);

      for (int i = 0; i < nr; i++)
        rvals.push_back(RealType(i * dr));

      vector<RealType> phivals;
      RealType r;

      for (unsigned int i = 0; i < rvals.size(); i++) {
        r    = rvals[i];
        rha  = 0.0;
        rhb  = 0.0;
        pha  = 0.0;
        phb  = 0.0;
        phab = 0.0;

        // rcut values are derived parameters if no splines are pre-set:

        if (r < data1.rcut) {
          rha = data1.rho->getValueAt(r);

          // pha = ZhouPhi(r, re1, A1, B1, alpha1, beta1, kappa1, lambda1);
          pha = Phi(r, re1, A1, B1, alpha1, beta1, kappa1, lambda1);
        }
        if (r < data2.rcut) {
          rhb = data2.rho->getValueAt(r);
          // phb =  ZhouPhi(r, re2, A2, B2, alpha2, beta2, kappa2, lambda2);
          phb = Phi(r, re2, A2, B2, alpha2, beta2, kappa2, lambda2);
        }

        if (r < data1.rcut) phab = phab + 0.5 * (rhb / rha) * pha;
        if (r < data2.rcut) phab = phab + 0.5 * (rha / rhb) * phb;

        phivals.push_back(phab);
      }
      cs->addPoints(rvals, phivals);
    }

    return cs;
  }